

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argvParser.cpp
# Opt level: O0

argParserAdvancedConfiguration * __thiscall
argvParser::addArg(argvParser *this,string *argvShort,string *argvLong,string *help,
                  function<int_(int,_char_**)> *callBack)

{
  vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
  *this_00;
  vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
  *this_01;
  bool bVar1;
  size_type sVar2;
  section *this_02;
  reference ppsVar3;
  argument *this_03;
  byte local_159;
  function<int_(int,_char_**)> local_120;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  argument *local_a0;
  section *local_98;
  byte local_89;
  string local_88 [48];
  string local_58 [32];
  function<int_(int,_char_**)> *local_38;
  function<int_(int,_char_**)> *callBack_local;
  string *help_local;
  string *argvLong_local;
  string *argvShort_local;
  argvParser *this_local;
  
  local_38 = callBack;
  callBack_local = (function<int_(int,_char_**)> *)help;
  help_local = argvLong;
  argvLong_local = argvShort;
  argvShort_local = (string *)this;
  std::__cxx11::string::string(local_58,(string *)argvShort);
  local_89 = 0;
  bVar1 = argParserAdvancedConfiguration::existArg
                    (&this->super_argParserAdvancedConfiguration,(string *)local_58);
  local_159 = 0;
  if (!bVar1) {
    std::__cxx11::string::string(local_88,(string *)argvLong);
    local_89 = 1;
    bVar1 = argParserAdvancedConfiguration::existArg
                      (&this->super_argParserAdvancedConfiguration,(string *)local_88);
    local_159 = bVar1 ^ 0xff;
  }
  if ((local_89 & 1) != 0) {
    std::__cxx11::string::~string(local_88);
  }
  std::__cxx11::string::~string(local_58);
  if ((local_159 & 1) == 0) {
    this_local = (argvParser *)0x0;
  }
  else {
    sVar2 = std::
            vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
            ::size((this->super_argParserAdvancedConfiguration).newargconfig);
    if (sVar2 == 0) {
      this_00 = (this->super_argParserAdvancedConfiguration).newargconfig;
      this_02 = (section *)operator_new(0x28);
      *(undefined8 *)&this_02->field_0x10 = 0;
      *(undefined8 *)&this_02->field_0x18 = 0;
      *(undefined8 *)this_02 = 0;
      *(undefined8 *)&this_02->field_0x8 = 0;
      this_02->arguments =
           (vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
            *)0x0;
      argParserAdvancedConfiguration::section::section(this_02);
      local_98 = this_02;
      std::
      vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
      ::push_back(this_00,&local_98);
    }
    ppsVar3 = std::
              vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
              ::back((this->super_argParserAdvancedConfiguration).newargconfig);
    this_01 = (*ppsVar3)->arguments;
    this_03 = (argument *)operator_new(0xf0);
    std::__cxx11::string::string(local_c0,(string *)argvShort);
    std::__cxx11::string::string(local_e0,(string *)argvLong);
    std::__cxx11::string::string(local_100,(string *)help);
    std::function<int_(int,_char_**)>::function(&local_120,callBack);
    argParserAdvancedConfiguration::argument::argument
              (this_03,(string *)local_c0,(string *)local_e0,(string *)local_100,&local_120);
    local_a0 = this_03;
    std::
    vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
    ::push_back(this_01,&local_a0);
    std::function<int_(int,_char_**)>::~function(&local_120);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_c0);
    this_local = this;
  }
  return &this_local->super_argParserAdvancedConfiguration;
}

Assistant:

argParserAdvancedConfiguration *
argvParser::addArg(string argvShort, string argvLong, string help, function<int(int, char **)> callBack) {
    if (!existArg(argvShort) && !existArg(argvLong)) {
        if(newargconfig->size() == 0){ // no section defined jet
            newargconfig->push_back(new section());
        }
        newargconfig->back()->arguments->push_back(new argument(argvShort, argvLong, help, callBack));
        return this;
    }
    return nullptr;
}